

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

bool __thiscall
AbstractModuleClient::sendStimulationStopGroup(AbstractModuleClient *this,uint16_t group)

{
  bool bVar1;
  TrodesMsg m;
  allocator local_59;
  string local_58;
  TrodesMsg local_38;
  
  TrodesMsg::TrodesMsg(&local_38);
  std::__cxx11::string::string((string *)&local_58,"ss2",&local_59);
  TrodesMsg::addcontents<char_const*,char_const*,unsigned_short>
            (&local_38,&local_58,"STOP","GROUP",group);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = MlmWrap::sendHardwareMessage(&this->super_MlmWrap,&local_38);
  TrodesMsg::~TrodesMsg(&local_38);
  return bVar1;
}

Assistant:

bool AbstractModuleClient::sendStimulationStopGroup(uint16_t group){
    TrodesMsg m;
    m.addcontents("ss2", "STOP", "GROUP", group);
    return sendHardwareMessage(m);
}